

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster_generic::try_direct_conversions(type_caster_generic *this,handle src)

{
  vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *this_00;
  _func_bool__object_ptr_void_ptr_ptr *p_Var1;
  bool bVar2;
  reference pp_Var3;
  PyObject **ppPVar4;
  _func_bool__object_ptr_void_ptr_ptr **converter;
  iterator __end2;
  iterator __begin2;
  vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *__range2;
  type_caster_generic *this_local;
  handle src_local;
  
  this_00 = this->typeinfo->direct_conversions;
  this_local = (type_caster_generic *)src.m_ptr;
  __end2 = std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
           ::begin(this_00);
  converter = (_func_bool__object_ptr_void_ptr_ptr **)
              std::
              vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>::
              end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<bool_(**)(_object_*,_void_*&),_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>
                                *)&converter);
    if (!bVar2) {
      return false;
    }
    pp_Var3 = __gnu_cxx::
              __normal_iterator<bool_(**)(_object_*,_void_*&),_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>
              ::operator*(&__end2);
    p_Var1 = *pp_Var3;
    ppPVar4 = handle::ptr((handle *)&this_local);
    bVar2 = (*p_Var1)(*ppPVar4,&this->value);
    if (bVar2) break;
    __gnu_cxx::
    __normal_iterator<bool_(**)(_object_*,_void_*&),_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool try_direct_conversions(handle src) {
        for (auto &converter : *typeinfo->direct_conversions) {
            if (converter(src.ptr(), value))
                return true;
        }
        return false;
    }